

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O3

size_t maxArgWidth(poptOption *opt,char *translation_domain)

{
  ulong uVar1;
  size_t sVar2;
  char *pcVar3;
  void *pvVar4;
  ulong uVar5;
  poptOption *opt_00;
  long lVar6;
  uint uVar7;
  mbstate_t local_40;
  char *local_38;
  
  if (opt == (poptOption *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    uVar1 = 0;
    for (; ((pcVar3 = opt->longName, pcVar3 != (char *)0x0 || (opt->shortName != '\0')) ||
           (opt->arg != (void *)0x0)); opt = opt + 1) {
      uVar7 = opt->argInfo;
      if ((_poptArgMask & uVar7) == 4) {
        opt_00 = (poptOption *)opt->arg;
        if ((poptOption *)opt->arg == poptHelpOptions) {
          opt_00 = poptHelpOptionsI18N;
        }
        if (opt_00 != (poptOption *)0x0) {
          uVar1 = maxArgWidth(opt_00,translation_domain);
        }
        if (uVar5 < uVar1) {
          uVar5 = uVar1;
        }
      }
      else if ((uVar7 >> 0x1e & 1) == 0) {
        if (pcVar3 == (char *)0x0) {
          lVar6 = 6;
        }
        else {
          sVar2 = strlen(pcVar3);
          lVar6 = (-1 < (int)uVar7) + sVar2 + 7;
        }
        pcVar3 = getArgDescrip(opt,translation_domain);
        if (pcVar3 != (char *)0x0) {
          pvVar4 = memchr(" =(",(int)*pcVar3,4);
          local_38 = pcVar3;
          sVar2 = strlen(pcVar3);
          local_40.__count = 0;
          local_40.__value = (_union_27)0x0;
          translation_domain = (char *)&local_38;
          sVar2 = mbsrtowcs((wchar_t *)0x0,(char **)translation_domain,sVar2,&local_40);
          lVar6 = lVar6 + sVar2 + (ulong)(pvVar4 == (void *)0x0);
          uVar7 = opt->argInfo;
        }
        uVar1 = (ulong)(uVar7 >> 0x1b & 2) + lVar6;
        if (uVar5 < uVar1) {
          uVar5 = uVar1;
        }
      }
    }
  }
  return uVar5;
}

Assistant:

static size_t maxArgWidth(const struct poptOption * opt,
		       const char * translation_domain)
{
    size_t max = 0;
    size_t len = 0;
    const char * argDescrip;
    
    if (opt != NULL)
    while (opt->longName || opt->shortName || opt->arg) {
	if (poptArgType(opt) == POPT_ARG_INCLUDE_TABLE) {
	    void * arg = opt->arg;
	    /* XXX sick hack to preserve pretense of ABI. */
	    if (arg == poptHelpOptions)
		arg = poptHelpOptionsI18N;
	    if (arg)	/* XXX program error */
		len = maxArgWidth(arg, translation_domain);
	    if (len > max) max = len;
	} else if (!F_ISSET(opt, DOC_HIDDEN)) {
	    len = sizeof("  ")-1;
	    /* XXX --long always padded for alignment with/without "-X, ". */
	    len += sizeof("-X, ")-1;
	    if (opt->longName) {
		len += (F_ISSET(opt, ONEDASH) ? sizeof("-") : sizeof("--")) - 1;
		len += strlen(opt->longName);
	    }

	    argDescrip = getArgDescrip(opt, translation_domain);

	    if (argDescrip) {

		/* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
		if (!strchr(" =(", argDescrip[0])) len += sizeof("=")-1;

		/* Adjust for (possible) wide characters. */
		len += stringDisplayWidth(argDescrip);
	    }

	    if (F_ISSET(opt, OPTIONAL)) len += sizeof("[]")-1;
	    if (len > max) max = len;
	}
	opt++;
    }
    
    return max;
}